

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

size_t __thiscall
avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::unionAdjust
          (SimpleParser<avro::parsing::ResolvingDecoderHandler> *this)

{
  reference this_00;
  pair<unsigned_long,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
  p;
  Symbol *s;
  Symbol *in_stack_ffffffffffffffa8;
  ProductionPtr *in_stack_ffffffffffffffc8;
  SimpleParser<avro::parsing::ResolvingDecoderHandler> *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  
  this_00 = std::
            stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
            ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                   *)0x1f02e1);
  Symbol::kind(this_00);
  assertMatch(sTerminalLow,0x1f02fc);
  Symbol::
  extra<std::pair<unsigned_long,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>>
            (in_stack_ffffffffffffffa8);
  std::
  stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
         *)0x1f0315);
  append(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::
  pair<unsigned_long,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
  ::~pair((pair<unsigned_long,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>
           *)0x1f033a);
  return local_28;
}

Assistant:

size_t unionAdjust() {
        const Symbol& s = parsingStack.top();
        assertMatch(Symbol::sUnionAdjust, s.kind());
        std::pair<size_t, ProductionPtr> p =
        s.extra<std::pair<size_t, ProductionPtr> >();
        parsingStack.pop();
        append(p.second);
        return p.first;
    }